

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3InsertData(Fts3Table *p,sqlite3_value **apVal,sqlite3_int64 *piDocid)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  sqlite3_value *psVar5;
  sqlite3_stmt *p_00;
  int iVar6;
  sqlite3_stmt *in_RAX;
  i64 iVar7;
  sqlite3_value *psVar8;
  sqlite3_stmt *pContentInsert;
  
  if (p->zContentTbl == (char *)0x0) {
    pContentInsert = in_RAX;
    iVar6 = fts3SqlStmt(p,0x12,&pContentInsert,apVal + 1);
    p_00 = pContentInsert;
    if (iVar6 != 0) {
      return iVar6;
    }
    if (p->zLanguageid != (char *)0x0) {
      iVar6 = p->nColumn;
      iVar7 = sqlite3VdbeIntValue(apVal[(long)iVar6 + 4]);
      iVar6 = sqlite3_bind_int(p_00,iVar6 + 2,(int)iVar7);
      if (iVar6 != 0) {
        return iVar6;
      }
    }
    psVar8 = apVal[(long)p->nColumn + 3];
    uVar2._0_2_ = psVar8->flags;
    uVar2._2_1_ = psVar8->enc;
    uVar2._3_1_ = psVar8->eSubtype;
    if ((0xaaaaaaaaU >> (uVar2 & 0x1f) & 1) == 0) {
      psVar5 = *apVal;
      uVar3._0_2_ = psVar5->flags;
      uVar3._2_1_ = psVar5->enc;
      uVar3._3_1_ = psVar5->eSubtype;
      if (((0xaaaaaaaaU >> (uVar3 & 0x1f) & 1) != 0) &&
         (psVar5 = apVal[1], uVar4._0_2_ = psVar5->flags, uVar4._2_1_ = psVar5->enc,
         uVar4._3_1_ = psVar5->eSubtype, (0xaaaaaaaaU >> (uVar4 & 0x1f) & 1) == 0)) {
        return 1;
      }
      iVar6 = sqlite3_bind_value(pContentInsert,1,psVar8);
      if (iVar6 != 0) {
        return iVar6;
      }
    }
    sqlite3_step(pContentInsert);
    iVar6 = sqlite3_reset(pContentInsert);
    iVar7 = p->db->lastRowid;
  }
  else {
    psVar8 = apVal[(long)p->nColumn + 3];
    uVar1 = psVar8->flags;
    if ((0xaaaaaaaaU >> (uVar1 & 0x1f) & 1) != 0) {
      psVar8 = apVal[1];
      uVar1 = psVar8->flags;
    }
    if ((0x50505050U >> (uVar1 & 0x1f) & 1) == 0) {
      return 0x13;
    }
    iVar7 = sqlite3VdbeIntValue(psVar8);
    iVar6 = 0;
  }
  *piDocid = iVar7;
  return iVar6;
}

Assistant:

static int fts3InsertData(
  Fts3Table *p,                   /* Full-text table */
  sqlite3_value **apVal,          /* Array of values to insert */
  sqlite3_int64 *piDocid          /* OUT: Docid for row just inserted */
){
  int rc;                         /* Return code */
  sqlite3_stmt *pContentInsert;   /* INSERT INTO %_content VALUES(...) */

  if( p->zContentTbl ){
    sqlite3_value *pRowid = apVal[p->nColumn+3];
    if( sqlite3_value_type(pRowid)==SQLITE_NULL ){
      pRowid = apVal[1];
    }
    if( sqlite3_value_type(pRowid)!=SQLITE_INTEGER ){
      return SQLITE_CONSTRAINT;
    }
    *piDocid = sqlite3_value_int64(pRowid);
    return SQLITE_OK;
  }

  /* Locate the statement handle used to insert data into the %_content
  ** table. The SQL for this statement is:
  **
  **   INSERT INTO %_content VALUES(?, ?, ?, ...)
  **
  ** The statement features N '?' variables, where N is the number of user
  ** defined columns in the FTS3 table, plus one for the docid field.
  */
  rc = fts3SqlStmt(p, SQL_CONTENT_INSERT, &pContentInsert, &apVal[1]);
  if( rc==SQLITE_OK && p->zLanguageid ){
    rc = sqlite3_bind_int(
        pContentInsert, p->nColumn+2, 
        sqlite3_value_int(apVal[p->nColumn+4])
    );
  }
  if( rc!=SQLITE_OK ) return rc;

  /* There is a quirk here. The users INSERT statement may have specified
  ** a value for the "rowid" field, for the "docid" field, or for both.
  ** Which is a problem, since "rowid" and "docid" are aliases for the
  ** same value. For example:
  **
  **   INSERT INTO fts3tbl(rowid, docid) VALUES(1, 2);
  **
  ** In FTS3, this is an error. It is an error to specify non-NULL values
  ** for both docid and some other rowid alias.
  */
  if( SQLITE_NULL!=sqlite3_value_type(apVal[3+p->nColumn]) ){
    if( SQLITE_NULL==sqlite3_value_type(apVal[0])
     && SQLITE_NULL!=sqlite3_value_type(apVal[1])
    ){
      /* A rowid/docid conflict. */
      return SQLITE_ERROR;
    }
    rc = sqlite3_bind_value(pContentInsert, 1, apVal[3+p->nColumn]);
    if( rc!=SQLITE_OK ) return rc;
  }

  /* Execute the statement to insert the record. Set *piDocid to the 
  ** new docid value. 
  */
  sqlite3_step(pContentInsert);
  rc = sqlite3_reset(pContentInsert);

  *piDocid = sqlite3_last_insert_rowid(p->db);
  return rc;
}